

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  void *dest_00;
  int iVar1;
  bool bVar2;
  timespec start;
  timespec end;
  char dest [22465];
  
  memcpy(dest,
         "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
         ,0x57c1);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy(dest,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy2(dest,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
  }
  clock_gettime(1,(timespec *)&end);
  dest_00 = (void *)0x0;
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dest_00 = my_memset(dest_00,"jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjj",0x35);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy(dest,
              "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
              ,0x1a1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy2(dest,
               "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
               ,0x1a1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dest_00 = my_memset(dest_00,
                        "jjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;l"
                        ,0x1a1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy(dest,
              "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
              ,0x57c1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    my_memcpy2(dest,
               "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
               ,0x57c1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, memcmp+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    dest_00 = my_memset(dest_00,
                        "jjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdfalksdj;flkajdsjjjaldskfa;lsdflllj;ljjjjjjjkkjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjkasdfjajslkdf;aldsfajjjjjjjjjjaldskfa;lsdflllj;ljjjjjjjkkjjjjjjjjjjjlllllllllllllllljjjjjjjjjjjjjjjjjjjjjjjkkjajslkdf;al..." /* TRUNCATED STRING LITERAL */
                        ,0x57c1);
  }
  clock_gettime(1,(timespec *)&end);
  printf("%s, realloc+memcpy:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  putchar(10);
  return 0;
}

Assistant:

int
main()
{
    int i;
    struct timespec start, end;
    long long t;
    size_t len;
    void *p = NULL;
    char *src = NULL;
    char dest[] = BUFF3;
    src = BUFF1;
    len = strlen(BUFF1) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF2;
    len = strlen(BUFF2) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    src = BUFF3;
    len = strlen(BUFF3) + 1;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        my_memcpy2(dest, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcmp+memcpy:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        p = my_memset(p, src, len);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc+memcpy:\n\t %lld\n", __func__, t);
    printf("\n");

    return 0;
}